

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_initialize
               (HTS_Vocoder *v,size_t m,size_t stage,HTS_Boolean use_log_gain,size_t rate,
               size_t fperiod)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined1 in_CL;
  long in_RDX;
  long in_RSI;
  undefined1 *in_RDI;
  size_t in_R8;
  size_t in_R9;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  *in_RDI = 1;
  *(long *)(in_RDI + 8) = in_RDX;
  if (in_RDX == 0) {
    *(undefined8 *)(in_RDI + 0x10) = 0;
  }
  else {
    uVar1 = *(undefined8 *)(in_RDI + 8);
    auVar4._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    *(double *)(in_RDI + 0x10) =
         -1.0 / ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  in_RDI[0x18] = in_CL;
  *(size_t *)(in_RDI + 0x20) = in_R9;
  *(undefined8 *)(in_RDI + 0x28) = 1;
  in_RDI[0x30] = 1;
  auVar3._8_4_ = (int)(in_R8 >> 0x20);
  auVar3._0_8_ = in_R8;
  auVar3._12_4_ = 0x45300000;
  *(double *)(in_RDI + 0x38) =
       (auVar3._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)in_R8) - 4503599627370496.0);
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x50) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  in_RDI[0x70] = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0x55555555;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = 0;
  *(undefined8 *)(in_RDI + 0x88) = 0;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  if (*(long *)(in_RDI + 8) == 0) {
    pvVar2 = HTS_calloc(in_R8,in_R9);
    *(void **)(in_RDI + 0xc0) = pvVar2;
    *(long *)(in_RDI + 200) = *(long *)(in_RDI + 0xc0) + in_RSI * 8 + 8;
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 200) + in_RSI * 8 + 8;
    *(long *)(in_RDI + 0xd8) = *(long *)(in_RDI + 0xd0) + in_RSI * 8 + 8;
  }
  else {
    pvVar2 = HTS_calloc(in_R8,in_R9);
    *(void **)(in_RDI + 0xc0) = pvVar2;
    *(long *)(in_RDI + 200) = *(long *)(in_RDI + 0xc0) + in_RSI * 8 + 8;
    *(long *)(in_RDI + 0xd0) = *(long *)(in_RDI + 200) + in_RSI * 8 + 8;
    *(long *)(in_RDI + 0xd8) = *(long *)(in_RDI + 0xd0) + in_RSI * 8 + 8;
  }
  return;
}

Assistant:

void HTS_Vocoder_initialize(HTS_Vocoder * v, size_t m, size_t stage, HTS_Boolean use_log_gain, size_t rate, size_t fperiod)
{
   /* set parameter */
   v->is_first = TRUE;
   v->stage = stage;
   if (stage != 0)
      v->gamma = -1.0 / v->stage;
   else
      v->gamma = 0.0;
   v->use_log_gain = use_log_gain;
   v->fprd = fperiod;
   v->next = SEED;
   v->gauss = GAUSS;
   v->rate = rate;
   v->pitch_of_curr_point = 0.0;
   v->pitch_counter = 0.0;
   v->pitch_inc_per_point = 0.0;
   v->excite_ring_buff = NULL;
   v->excite_buff_size = 0;
   v->excite_buff_index = 0;
   v->sw = 0;
   v->x = 0x55555555;
   /* init buffer */
   v->freqt_buff = NULL;
   v->freqt_size = 0;
   v->gc2gc_buff = NULL;
   v->gc2gc_size = 0;
   v->lsp2lpc_buff = NULL;
   v->lsp2lpc_size = 0;
   v->postfilter_buff = NULL;
   v->postfilter_size = 0;
   v->spectrum2en_buff = NULL;
   v->spectrum2en_size = 0;
   if (v->stage == 0) {         /* for MCP */
      v->c = (double *) HTS_calloc(m * (3 + PADEORDER) + 5 * PADEORDER + 6, sizeof(double));
      v->cc = v->c + m + 1;
      v->cinc = v->cc + m + 1;
      v->d1 = v->cinc + m + 1;
   } else {                     /* for LSP */
      v->c = (double *) HTS_calloc((m + 1) * (v->stage + 3), sizeof(double));
      v->cc = v->c + m + 1;
      v->cinc = v->cc + m + 1;
      v->d1 = v->cinc + m + 1;
   }
}